

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

void __thiscall BooleanInstance::BooleanInstance(BooleanInstance *this,string *value)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Boolean","");
  Instance::Instance(&this->super_Instance,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_Instance)._vptr_Instance = (_func_int **)&PTR__CharacterInstance_0016be00;
  bVar1 = Grammar::is_boolean_value(value);
  if (bVar1) {
    iVar2 = std::__cxx11::string::compare((char *)value);
    this->_value = iVar2 == 0;
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

BooleanInstance::BooleanInstance(const std::string& value) : Instance("Boolean") {
    if (!Grammar::is_boolean_value(value))
        throw EXC_INVALID_ARGUMENT;
    _value = (value == "true");
}